

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyle::Internal_SetStringMember
          (ON_DimStyle *this,field field_id,wchar_t *value,ON_wString *class_member)

{
  bool bVar1;
  wchar_t *other_string;
  
  bVar1 = ON_wString::IsValid(class_member,true);
  other_string = L"";
  if (bVar1) {
    other_string = value;
  }
  bVar1 = ON_wString::EqualOrdinal(class_member,other_string,false);
  if (!bVar1) {
    ON_wString::operator=(class_member,other_string);
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return !bVar1;
}

Assistant:

bool ON_DimStyle::Internal_SetStringMember(
  ON_DimStyle::field field_id,
  const wchar_t* value,
  ON_wString& class_member
)
{
  if (false == class_member.IsValid(true))
  {
    // just in case value pointed to the bogus string array.
    value = L"";
  }
  bool bValueChanged = false;
  if (false == class_member.EqualOrdinal(value,false) )
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}